

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvode_ls.c
# Opt level: O3

int CVodeGetNumPrecEvals(void *cvode_mem,long *npevals)

{
  int iVar1;
  CVLsMem cvls_mem;
  CVodeMem cv_mem;
  CVLsMem local_18;
  CVodeMem local_10;
  
  iVar1 = cvLs_AccessLMem(cvode_mem,"CVodeGetNumPrecEvals",&local_10,&local_18);
  if (iVar1 == 0) {
    *npevals = local_18->npe;
  }
  return iVar1;
}

Assistant:

int CVodeGetNumPrecEvals(void* cvode_mem, long int* npevals)
{
  CVodeMem cv_mem;
  CVLsMem cvls_mem;
  int retval;

  /* access CVLsMem structure; set output value and return */
  retval = cvLs_AccessLMem(cvode_mem, __func__, &cv_mem, &cvls_mem);
  if (retval != CVLS_SUCCESS) { return (retval); }
  *npevals = cvls_mem->npe;
  return (CVLS_SUCCESS);
}